

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O1

bool ON_OrderEdgesAroundVertex(ON_Brep *B,int vid,ON_2dex *trim_ends,bool *bClosed)

{
  ulong uVar1;
  ON_BrepVertex *pOVar2;
  int *piVar3;
  uint *puVar4;
  bool bVar5;
  uint uVar6;
  ON_BrepEdge *pOVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  byte unaff_BPL;
  long lVar11;
  int iVar12;
  ON_BrepTrim *this;
  
  *bClosed = false;
  if (-1 < vid) {
    pOVar2 = (B->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_a;
    if (-1 < pOVar2[(uint)vid].m_vertex_index) {
      *bClosed = true;
      lVar8 = (long)pOVar2[(uint)vid].m_ei.m_count;
      if (0 < lVar8) {
        piVar3 = pOVar2[(uint)vid].m_ei.m_a;
        pOVar7 = (B->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
        lVar11 = 0;
        do {
          iVar12 = pOVar7[piVar3[lVar11]].m_ti.m_count;
          if (iVar12 == 2) {
            iVar12 = 4;
          }
          else if (iVar12 == 1) {
            *bClosed = false;
            iVar12 = 2;
          }
          else {
            iVar12 = 1;
          }
          if (iVar12 != 4) {
            if (iVar12 != 2) goto LAB_0041cf9d;
            break;
          }
          lVar11 = lVar11 + 1;
        } while (lVar8 != lVar11);
      }
      if (*bClosed != true) {
        bVar5 = OrderEdgesAroundOpenVertex(B,vid,trim_ends);
        return bVar5;
      }
      pOVar2 = (B->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_a;
      if ((-1 < pOVar2[(uint)vid].m_vertex_index) && (0 < pOVar2[(uint)vid].m_ei.m_count)) {
        iVar12 = *pOVar2[(uint)vid].m_ei.m_a;
        pOVar7 = (B->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
        if (pOVar7[iVar12].m_ti.m_count == 2) {
          piVar3 = pOVar7[iVar12].m_ti.m_a;
          trim_ends->i = *piVar3;
          trim_ends->j = (uint)(byte)(pOVar7[iVar12].m_vi[0] != vid ^
                                     (B->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                                     super_ON_ClassArray<ON_BrepTrim>.m_a[*piVar3].m_bRev3d);
          uVar9 = 0;
          do {
            if ((long)pOVar2[(uint)vid].m_ei.m_count <= (long)uVar9) goto LAB_0041cf9d;
            if (trim_ends[uVar9].j == 0) {
              uVar6 = ON_Brep::PrevNonsingularTrim(B,trim_ends[uVar9].i);
            }
            else {
              uVar6 = ON_Brep::NextNonsingularTrim(B,trim_ends[uVar9].i);
            }
            uVar1 = uVar9 + 1;
            if ((int)uVar6 < 0) {
              bVar5 = false;
              unaff_BPL = 0;
            }
            else {
              this = (B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a
                     + uVar6;
              pOVar7 = ON_BrepTrim::Edge(this);
              if ((pOVar7 == (ON_BrepEdge *)0x0) || ((pOVar7->m_ti).m_count != 2)) {
LAB_0041cf52:
                unaff_BPL = 0;
                bVar5 = false;
              }
              else {
                puVar4 = (uint *)(pOVar7->m_ti).m_a;
                uVar6 = puVar4[*puVar4 == uVar6];
                iVar12 = 1 - trim_ends[uVar9].j;
                if ((B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a
                    [(int)uVar6].m_bRev3d != this->m_bRev3d) {
                  iVar12 = trim_ends[uVar9].j;
                }
                if ((uVar6 == trim_ends->i) && (iVar12 == trim_ends->j)) {
                  unaff_BPL = uVar1 == (uint)pOVar2[(uint)vid].m_ei.m_count;
                  bVar5 = false;
                }
                else {
                  if (uVar9 != 0) {
                    uVar10 = 0;
                    do {
                      if ((uVar6 == trim_ends[uVar10 + 1].i) && (iVar12 == trim_ends[uVar10 + 1].j))
                      goto LAB_0041cf52;
                      uVar10 = uVar10 + 1;
                    } while (uVar9 != uVar10);
                  }
                  trim_ends[uVar1].i = uVar6;
                  trim_ends[uVar1].j = iVar12;
                  bVar5 = true;
                }
              }
            }
            uVar9 = uVar1;
          } while (bVar5);
          goto LAB_0041cf9f;
        }
      }
    }
  }
LAB_0041cf9d:
  unaff_BPL = 0;
LAB_0041cf9f:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool ON_OrderEdgesAroundVertex(const ON_Brep& B, int vid,
                               ON_2dex* trim_ends,//Must be at as big as the edge count at the vertex
                               bool& bClosed)

{
  bClosed = false;
  if (vid<0)
    return false;
  const ON_BrepVertex& V = B.m_V[vid];
  if (V.m_vertex_index < 0)
    return false;
  int i;
  bClosed = true;
  for (i=0; i<V.m_ei.Count(); i++){
    const ON_BrepEdge& E = B.m_E[V.m_ei[i]];
    if (E.m_ti.Count() == 2)
      continue;
    if (E.m_ti.Count() == 1){
      bClosed = false;
      break;
    }
    return false;
  }
  return (bClosed) ? 
    OrderEdgesAroundClosedVertex(B, vid, trim_ends) : OrderEdgesAroundOpenVertex(B, vid, trim_ends);
}